

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O3

void google::protobuf::compiler::java::anon_unknown_8::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Context *context)

{
  slot_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint8_t uVar3;
  ctrl_t *pcVar4;
  pointer pcVar5;
  OneofDescriptor *pOVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined1 src [8];
  bool bVar9;
  Type TVar10;
  int iVar11;
  Nonnull<char_*> pcVar12;
  uint uVar13;
  char *pcVar14;
  int bitIndex;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  undefined4 in_register_00000014;
  JavaType type;
  anon_union_8_1_a8a14541_for_iterator_2 aVar15;
  anon_union_8_1_a8a14541_for_iterator_2 aVar16;
  anon_union_8_1_a8a14541_for_iterator_2 *options;
  AlphaNum *pAVar17;
  string_view sVar18;
  string_view input;
  string result;
  string name;
  string capitalized_type;
  anon_union_8_1_a8a14541_for_iterator_2 local_230;
  anon_union_8_1_a8a14541_for_iterator_2 local_228;
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [32];
  string local_1d0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [56];
  undefined1 local_148 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_140;
  long local_138 [2];
  uint local_128;
  JavaType local_124;
  anon_union_8_1_a8a14541_for_iterator_2 local_120;
  anon_union_8_1_a8a14541_for_iterator_2 local_118;
  undefined1 local_110 [32];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&> local_f0
  ;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_e8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  local_128 = messageBitIndex;
  SetCommonFieldVariables
            (descriptor,(FieldGeneratorInfo *)CONCAT44(in_register_00000014,builderBitIndex),
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)name_resolver);
  local_180._48_8_ = descriptor;
  local_124 = GetJavaType(descriptor);
  sVar18 = PrimitiveTypeName(local_124);
  local_230.slot_ = (slot_type *)local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,sVar18._M_str,sVar18._M_str + sVar18._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [5])0x10fbe0b);
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_230);
  if (local_230.slot_ != (slot_type *)local_220) {
    operator_delete(local_230.slot_,local_220._0_8_ + 1);
  }
  sVar18 = BoxedPrimitiveTypeName(local_124);
  local_230.slot_ = (slot_type *)local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,sVar18._M_str,sVar18._M_str + sVar18._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [11])"boxed_type");
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_230);
  if (local_230.slot_ != (slot_type *)local_220) {
    operator_delete(local_230.slot_,local_220._0_8_ + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [5])0x10fbe0b);
  local_230.slot_ = (slot_type *)&DAT_0000000a;
  local_228.slot_ = (slot_type *)0x1357b2d;
  local_220._0_8_ = (slot_type *)(local_220 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,*(long *)(local_180._8_8_ + 0x10),
             *(long *)(local_180._8_8_ + 0x18) + *(long *)(local_180._8_8_ + 0x10));
  options = &local_1b0;
  local_200._0_8_ = name_resolver;
  local_1b0.slot_ = (slot_type *)&local_230;
  local_1a8.slot_ = (slot_type *)local_220;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),local_200,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_230,
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)options,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)&local_1a8);
  if ((slot_type *)local_220._0_8_ != (slot_type *)(local_220 + 0x10)) {
    operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
  }
  local_80._0_4_ =
       *(undefined4 *)
        &variables[2].
         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_;
  local_80._4_2_ =
       *(undefined2 *)
        ((long)&variables[2].
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ + 4);
  pcVar4 = variables[2].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar4,
             pcVar4 + *(long *)((long)&variables[2].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  pcVar4 = variables[3].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,
             pcVar4 + *(long *)((long)&variables[3].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  local_38 = *(undefined2 *)
              &variables[4].
               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_;
  ImmutableDefaultValue_abi_cxx11_
            ((string *)&local_230,(java *)local_180._48_8_,(FieldDescriptor *)info,
             (ClassNameResolver *)local_80,(Options *)options);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[8]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [8])0x10fb8da);
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_230);
  if (local_230.slot_ != (slot_type *)local_220) {
    operator_delete(local_230.slot_,(ulong)(local_220._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  local_d0._0_4_ =
       *(undefined4 *)
        &variables[2].
         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_;
  local_d0._4_2_ =
       *(undefined2 *)
        ((long)&variables[2].
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ + 4);
  pcVar4 = variables[2].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar4,
             pcVar4 + *(long *)((long)&variables[2].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  pcVar4 = variables[3].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar4,
             pcVar4 + *(long *)((long)&variables[3].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  local_88 = *(undefined2 *)
              &variables[4].
               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_;
  sVar18 = GetCapitalizedType((FieldDescriptor *)local_180._48_8_,true,(Options *)local_d0);
  local_230.slot_ = (slot_type *)local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,sVar18._M_str,sVar18._M_str + sVar18._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [17])"capitalized_type");
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_230);
  if (local_230.slot_ != (slot_type *)local_220) {
    operator_delete(local_230.slot_,(ulong)(local_220._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  uVar8 = local_180._48_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  iVar11 = *(int *)(uVar8 + 4);
  bVar9 = FieldDescriptor::is_packed((FieldDescriptor *)uVar8);
  uVar13 = 2;
  if (!bVar9) {
    uVar13 = *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)*(uint8_t *)(local_180._48_8_ + 2) * 4);
  }
  pcVar12 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                      (iVar11 << 3 | uVar13,(Nonnull<char_*>)local_220);
  local_230.slot_ = (slot_type *)(pcVar12 + -(long)local_220);
  pvVar7 = (void *)((long)local_180 + 0x10);
  local_228.slot_ = (slot_type *)local_220;
  local_180._0_8_ = pvVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_1a0 + 0x20),(slot_type *)local_220,pcVar12);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[4]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1b0,name_resolver,(char (*) [4])0x1323e1c);
  std::__cxx11::string::operator=
            ((string *)((long)local_1a8.slot_ + 0x10),(string *)(local_1a0 + 0x20));
  uVar8 = local_180._48_8_;
  if ((void *)local_180._0_8_ != pvVar7) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  iVar11 = *(int *)(uVar8 + 4);
  TVar10 = GetType((FieldDescriptor *)uVar8);
  uVar13 = iVar11 * 8 + 1;
  iVar11 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> iVar11 == 0; iVar11 = iVar11 + -1) {
    }
  }
  pcVar12 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                      ((ulong)(iVar11 * 9 + 0x49U >> 6) << (TVar10 == TYPE_GROUP),
                       (Nonnull<char_*>)local_220);
  local_230.slot_ = (slot_type *)(pcVar12 + -(long)local_220);
  local_228.slot_ = (slot_type *)local_220;
  local_180._0_8_ = pvVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_1a0 + 0x20),(slot_type *)local_220,pcVar12);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1b0,name_resolver,(char (*) [9])"tag_size");
  std::__cxx11::string::operator=
            ((string *)((long)local_1a8.slot_ + 0x10),(string *)(local_1a0 + 0x20));
  if ((void *)local_180._0_8_ != pvVar7) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  bVar9 = FieldDescriptor::is_required((FieldDescriptor *)uVar8);
  pcVar14 = "optional_bool: false";
  if (bVar9) {
    pcVar14 = "Saw json_name: true";
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_230,name_resolver,(char (*) [9])0x11bd065);
  pAVar17 = (AlphaNum *)((ulong)bVar9 ^ 5);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_228.slot_ + 0x10),0,*(char **)((long)local_228.slot_ + 0x18),
             (ulong)(pcVar14 + 0xf));
  type = local_124;
  sVar18 = PrimitiveTypeName(local_124);
  input._M_len = sVar18._M_str;
  input._M_str = (char *)0x1;
  UnderscoresToCamelCase_abi_cxx11_
            ((string *)&local_120,(java *)sVar18._M_len,input,SUB81(pAVar17,0));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_230,name_resolver,(char (*) [5])0x10a9ad3);
  pcVar5 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)local_228.slot_ + 0x10))->_M_dataplus)._M_p;
  local_148 = (undefined1  [8])local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,pcVar5,pcVar5 + *(size_type *)((long)local_228.slot_ + 0x18));
  if (type < JAVATYPE_STRING) {
    local_230.slot_ = (slot_type *)&DAT_0000001d;
    local_228.slot_ = (slot_type *)0x13499fa;
    local_180._0_8_ = local_118;
    local_180._8_8_ = local_120;
    local_1b0.slot_ = (slot_type *)&DAT_00000004;
    local_1a8.slot_ = (slot_type *)0x12f789d;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar17);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [16])"field_list_type");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    psVar1 = (slot_type *)(local_200 + 0x10);
    if ((slot_type *)local_200._0_8_ != psVar1) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
    local_230.slot_ = (slot_type *)&DAT_00000005;
    local_228.slot_ = (slot_type *)0x106fb39;
    local_180._0_8_ = local_118;
    local_180._8_8_ = local_120;
    local_1b0.slot_ = (slot_type *)&DAT_00000006;
    local_1a8.slot_ = (slot_type *)0x13579ad;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar17);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [11])"empty_list");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    if ((slot_type *)local_200._0_8_ != psVar1) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
    local_230.slot_ = (slot_type *)local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000011;
    local_180._8_8_ = "_.makeImmutable()";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_140.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_200,name_resolver,(char (*) [23])"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)(local_200._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_230.slot_ = (slot_type *)local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.get";
    local_1b0 = local_118;
    local_1a8 = local_120;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar17);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [13])"repeated_get");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    if ((slot_type *)local_200._0_8_ != psVar1) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
    local_230 = local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.add";
    local_1b0 = local_118;
    local_1a8 = local_120;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar17);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [13])"repeated_add");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    if ((slot_type *)local_200._0_8_ != psVar1) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
    local_230 = local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.set";
    local_1b0 = local_118;
    local_1a8 = local_120;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar17);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [13])"repeated_set");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    if ((slot_type *)local_200._0_8_ != psVar1) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [11])"visit_type");
    std::__cxx11::string::_M_assign((string *)((long)local_228.slot_ + 0x10));
    local_230.slot_ = (slot_type *)&DAT_00000005;
    local_228.slot_ = (slot_type *)0x1356088;
    local_180._0_8_ = local_118;
    local_180._8_8_ = local_120;
    local_1b0.slot_ = (slot_type *)&DAT_00000004;
    local_1a8.slot_ = (slot_type *)0x12f789d;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar17);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [16])"visit_type_list");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    if ((slot_type *)local_200._0_8_ != psVar1) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
  }
  else {
    local_180._0_8_ = &DAT_0000002a;
    local_180._8_8_ = "com.google.protobuf.Internal.ProtobufList<";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_200,name_resolver,(char (*) [11])"boxed_type");
    local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2)
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_200._8_8_ + 0x10))->_M_dataplus)._M_p;
    local_1b0 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_200._8_8_ + 0x18);
    local_200._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
    local_200._8_8_ =
         (long)
         "optional_int32: 1\noptional_int64: 2\n  optional_double: 2.4\nrepeated_int32: 5\nrepeated_int32: 10\noptional_nested_message <\n  bb: 78\n>\nrepeated_nested_message <\n  bb: 79\n>\nrepeated_nested_message <\n  bb: 80\n>"
         + 0xcd;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1d0,(lts_20250127 *)(local_1a0 + 0x20),(AlphaNum *)&local_1b0,
               (AlphaNum *)local_200,pAVar17);
    local_230.slot_ = (slot_type *)&DAT_0000000f;
    local_228.slot_ = (slot_type *)0x1349a18;
    paVar2 = &local_1d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == paVar2) {
      local_220._24_8_ = local_1d0.field_2._8_8_;
      local_220._0_8_ = (slot_type *)(local_220 + 0x10);
    }
    else {
      local_220._0_8_ = local_1d0._M_dataplus._M_p;
    }
    local_220._17_7_ = local_1d0.field_2._M_allocated_capacity._1_7_;
    local_220[0x10] = local_1d0.field_2._M_local_buf[0];
    local_220._8_8_ = local_1d0._M_string_length;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_f0.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          )local_220;
    local_1d0._M_dataplus._M_p = (pointer)paVar2;
    local_110._16_8_ = name_resolver;
    local_110._24_8_ = &local_230;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              (&local_e8,local_110 + 0x10,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_230,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_110 + 0x18)
               ,&local_f0);
    if ((slot_type *)local_220._0_8_ != (slot_type *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                               local_1d0.field_2._M_local_buf[0]) + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [11])"empty_list");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_228.slot_ + 0x10),0,*(char **)((long)local_228.slot_ + 0x18),
               0x13579a0);
    local_230.slot_ = (slot_type *)local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000011;
    local_180._8_8_ = "_.makeImmutable()";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_140.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_200,name_resolver,(char (*) [23])"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)(local_200._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_230.slot_ = (slot_type *)local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.get";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_140.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_200,name_resolver,(char (*) [13])"repeated_get");
    std::__cxx11::string::operator=((string *)(local_200._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_230.slot_ = (slot_type *)local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.add";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_140.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_200,name_resolver,(char (*) [13])"repeated_add");
    std::__cxx11::string::operator=((string *)(local_200._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_230.slot_ = (slot_type *)local_140;
    local_228 = (anon_union_8_1_a8a14541_for_iterator_2)local_148;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.set";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_140.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_200,name_resolver,(char (*) [13])"repeated_set");
    std::__cxx11::string::operator=((string *)(local_200._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [11])"visit_type");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_228.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,0x12f1c19);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [16])"visit_type_list");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_228.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,0x13560c9);
    aVar15 = local_140;
    src = local_148;
    if (type == JAVATYPE_BYTES) {
      local_200._8_8_ = (slot_type *)0x0;
      local_1f0[0] = '\0';
      local_200._0_8_ = (slot_type *)(local_200 + 0x10);
      std::__cxx11::string::resize((ulong)local_200,local_140._0_1_);
      absl::lts_20250127::ascii_internal::AsciiStrToUpper
                ((Nonnull<char_*>)local_200._0_8_,(Nullable<const_char_*>)src,(size_t)aVar15);
      local_230.slot_ = (slot_type *)local_200._8_8_;
      local_228.slot_ = (slot_type *)local_200._0_8_;
      local_180._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0xe;
      local_180._8_8_ = "_DEFAULT_VALUE";
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)local_200._8_8_);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[14]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [14])"bytes_default");
      std::__cxx11::string::operator=
                ((string *)(local_1d0._M_string_length + 0x10),(string *)&local_1b0);
      if (local_1b0.slot_ != (slot_type *)local_1a0) {
        operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
      }
      type = local_124;
      if ((slot_type *)local_200._0_8_ != (slot_type *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
        type = local_124;
      }
    }
  }
  bVar9 = IsReferenceType(type);
  if (bVar9) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [11])0x133e80f);
    pcVar14 = "  java.lang.Class<?> valueClass = value.getClass();\n";
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [11])0x133e80f);
    pcVar14 = anon_var_dwarf_a22956 + 5;
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_228.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,(ulong)pcVar14);
  bVar9 = ((*(FieldOptions **)(local_180._48_8_ + 0x38))->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_230,name_resolver,(char (*) [12])"deprecation");
  pcVar14 = anon_var_dwarf_a22956 + 5;
  if (bVar9 != false) {
    pcVar14 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_228.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,(ulong)pcVar14);
  uVar8 = local_180._48_8_;
  TVar10 = GetType((FieldDescriptor *)local_180._48_8_);
  iVar11 = FixedSize(TVar10);
  if (iVar11 != -1) {
    pcVar12 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        (iVar11,(Nonnull<char_*>)local_220);
    local_230.slot_ = (slot_type *)(pcVar12 + -(long)local_220);
    local_180._0_8_ = (long)local_180 + 0x10;
    local_228.slot_ = (slot_type *)local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_1a0 + 0x20),(slot_type *)local_220,pcVar12);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1b0,name_resolver,(char (*) [11])"fixed_size");
    std::__cxx11::string::operator=
              ((string *)((long)local_1a8.slot_ + 0x10),(string *)(local_1a0 + 0x20));
    if ((slot_type *)local_180._0_8_ != (slot_type *)((long)local_180 + 0x10U)) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
  }
  bVar9 = FieldDescriptor::has_presence((FieldDescriptor *)uVar8);
  if (bVar9) {
    if ((*(undefined1 *)(uVar8 + 3) & 1) != 0) {
      if ((*(undefined1 *)(uVar8 + 1) & 0x10) == 0) {
        iVar11 = 0xb63;
LAB_00ea4fc7:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,iVar11);
      }
      pOVar6 = ((anon_union_8_2_2904990b_for_scope_ *)(uVar8 + 0x28))->containing_oneof;
      if (pOVar6 == (OneofDescriptor *)0x0) {
        iVar11 = 0xb31;
        goto LAB_00ea4fc7;
      }
      if ((pOVar6->field_count_ == 1) && ((pOVar6->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_230,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_230);
      }
      goto LAB_00ea49c4;
    }
    GenerateSetBit_abi_cxx11_((string *)local_200,(java *)(ulong)local_128,bitIndex);
    local_230.slot_ = (slot_type *)local_200._8_8_;
    local_228.slot_ = (slot_type *)local_200._0_8_;
    local_180._0_8_ = 1;
    local_180._8_8_ = ";";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_200._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[26]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [26])"set_has_field_bit_message");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)&local_1b0);
    iVar11 = extraout_EDX;
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
      iVar11 = extraout_EDX_00;
    }
    if ((slot_type *)local_200._0_8_ != (slot_type *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
      iVar11 = extraout_EDX_01;
    }
    GenerateClearBit_abi_cxx11_((string *)local_200,(java *)(ulong)local_128,iVar11);
    local_230.slot_ = (slot_type *)local_200._8_8_;
    local_228.slot_ = (slot_type *)local_200._0_8_;
    local_180._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
    local_180._8_8_ = ";";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_200._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[28]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [28])"clear_has_field_bit_message");
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)&local_1b0);
    iVar11 = extraout_EDX_02;
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
      iVar11 = extraout_EDX_03;
    }
    if ((slot_type *)local_200._0_8_ != (slot_type *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
      iVar11 = extraout_EDX_04;
    }
    GenerateGetBit_abi_cxx11_((string *)&local_230,(java *)(ulong)local_128,iVar11);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_1a0 + 0x20),name_resolver,(char (*) [25])"is_field_present_message");
    std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_230);
    aVar15 = (anon_union_8_1_a8a14541_for_iterator_2)local_220._0_8_;
    aVar16 = local_230;
    if (local_230.slot_ == (slot_type *)local_220) goto LAB_00ea4ee0;
  }
  else {
LAB_00ea49c4:
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[26]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [26])"set_has_field_bit_message");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_228.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,0x10f75f1);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[28]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_230,name_resolver,(char (*) [28])"clear_has_field_bit_message");
    pAVar17 = (AlphaNum *)0x0;
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_228.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,0x10f75f1);
    uVar3 = *(uint8_t *)(uVar8 + 2);
    if (uVar3 == '\x01') {
      local_230 = (anon_union_8_1_a8a14541_for_iterator_2)0x25;
      local_228.slot_ = (slot_type *)0x134a3ef;
      local_180._0_8_ = local_140;
      local_180._8_8_ = local_148;
      local_1b0.slot_ = (slot_type *)&DAT_00000007;
      local_1a8.slot_ = (slot_type *)0x1356131;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)&local_1b0,pAVar17);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[25]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [25])"is_field_present_message");
    }
    else if (uVar3 == '\x02') {
      local_230 = (anon_union_8_1_a8a14541_for_iterator_2)0x22;
      local_228.slot_ = (slot_type *)0x134a3cc;
      local_180._0_8_ = local_140;
      local_180._8_8_ = local_148;
      local_1b0.slot_ = (slot_type *)&DAT_00000007;
      local_1a8.slot_ = (slot_type *)0x1356131;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)&local_1b0,pAVar17);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[25]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [25])"is_field_present_message");
    }
    else {
      if (uVar3 != '\f') {
        local_180._0_8_ = local_140;
        local_180._8_8_ = local_148;
        local_1b0.slot_ = (slot_type *)&DAT_00000005;
        local_1a8.slot_ = (slot_type *)0x1356139;
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::try_emplace_impl<char_const(&)[8]>(&local_e8,name_resolver,(char (*) [8])0x10fb8da);
        local_200._8_8_ = *(undefined8 *)((long)local_e8.first.field_1.slot_ + 0x10);
        local_200._0_8_ =
             *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_e8.first.field_1.slot_ + 0x18);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_1d0,(lts_20250127 *)(local_1a0 + 0x20),(AlphaNum *)&local_1b0,
                   (AlphaNum *)local_200,pAVar17);
        local_230.slot_ = (slot_type *)&DAT_00000018;
        local_228.slot_ = (slot_type *)0x13477eb;
        paVar2 = &local_1d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar2) {
          local_220._24_8_ = local_1d0.field_2._8_8_;
          local_220._0_8_ = (slot_type *)(local_220 + 0x10);
        }
        else {
          local_220._0_8_ = local_1d0._M_dataplus._M_p;
        }
        local_220._17_7_ = local_1d0.field_2._M_allocated_capacity._1_7_;
        local_220[0x10] = local_1d0.field_2._M_local_buf[0];
        local_220._8_8_ = local_1d0._M_string_length;
        local_1d0._M_string_length = 0;
        local_1d0.field_2._M_local_buf[0] = '\0';
        local_f0.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              )local_220;
        local_1d0._M_dataplus._M_p = (pointer)paVar2;
        local_110._16_8_ = name_resolver;
        local_110._24_8_ = &local_230;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::EmplaceDecomposable::operator()
                  (&local_e8,local_110 + 0x10,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_230,
                   (piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)
                   (local_110 + 0x18),&local_f0);
        if ((slot_type *)local_220._0_8_ != (slot_type *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar2) goto LAB_00ea4ee0;
        aVar15._1_7_ = local_1d0.field_2._M_allocated_capacity._1_7_;
        aVar15._0_1_ = local_1d0.field_2._M_local_buf[0];
        aVar16 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._M_dataplus._M_p;
        goto LAB_00ea4ed8;
      }
      local_230 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
      local_228.slot_ = (slot_type *)0x117569e;
      local_180._0_8_ = local_140;
      local_180._8_8_ = local_148;
      local_1b0.slot_ = (slot_type *)&DAT_0000000b;
      local_1a8.slot_ = (slot_type *)0x1356125;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_200,(lts_20250127 *)&local_230,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)&local_1b0,pAVar17);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[25]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [25])"is_field_present_message");
    }
    std::__cxx11::string::operator=
              ((string *)(local_1d0._M_string_length + 0x10),(string *)local_200);
    if ((slot_type *)local_200._0_8_ == (slot_type *)(local_200 + 0x10)) goto LAB_00ea4ee0;
    aVar15._1_7_ = local_1f0._1_7_;
    aVar15._0_1_ = local_1f0[0];
    aVar16 = (anon_union_8_1_a8a14541_for_iterator_2)local_200._0_8_;
  }
LAB_00ea4ed8:
  operator_delete(aVar16.slot_,(ulong)((long)aVar15.slot_ + 1));
LAB_00ea4ee0:
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[2]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_230,name_resolver,(char (*) [2])0x11df38e);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_228.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,0x10f75f1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[2]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_230,name_resolver,(char (*) [2])0x11e92ba);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_228.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_228.slot_ + 0x18))->_M_allocated_capacity,0x10f75f1);
  if (local_148 != (undefined1  [8])local_138) {
    operator_delete((void *)local_148,local_138[0] + 1);
  }
  if (local_120.slot_ != (slot_type *)local_110) {
    operator_delete(local_120.slot_,local_110._0_8_ + 1);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    const FieldGeneratorInfo* info, ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* variables,
    Context* context) {
  SetCommonFieldVariables(descriptor, info, variables);
  JavaType javaType = GetJavaType(descriptor);
  (*variables)["type"] = std::string(PrimitiveTypeName(javaType));
  (*variables)["boxed_type"] = std::string(BoxedPrimitiveTypeName(javaType));
  variables->insert({"field_type", (*variables)["type"]});
  (*variables)["default"] =
      ImmutableDefaultValue(descriptor, name_resolver, context->options());
  (*variables)["capitalized_type"] = std::string(GetCapitalizedType(
      descriptor, /* immutable = */ true, context->options()));
  (*variables)["tag"] =
      absl::StrCat(static_cast<int32_t>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = absl::StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";

  std::string capitalized_type = UnderscoresToCamelCase(
      PrimitiveTypeName(javaType), true /* cap_next_letter */);
  std::string name = (*variables)["name"];
  switch (javaType) {
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
      (*variables)["field_list_type"] = absl::StrCat(
          "com.google.protobuf.Internal.", capitalized_type, "List");
      (*variables)["empty_list"] =
          absl::StrCat("empty", capitalized_type, "List()");
      (*variables)["make_name_unmodifiable"] =
          absl::StrCat(name, "_.makeImmutable()");
      (*variables)["repeated_get"] =
          absl::StrCat(name, "_.get", capitalized_type);
      (*variables)["repeated_add"] =
          absl::StrCat(name, "_.add", capitalized_type);
      (*variables)["repeated_set"] =
          absl::StrCat(name, "_.set", capitalized_type);
      (*variables)["visit_type"] = capitalized_type;
      (*variables)["visit_type_list"] =
          absl::StrCat("visit", capitalized_type, "List");
      break;
    default:
      variables->insert(
          {"field_list_type",
           absl::StrCat("com.google.protobuf.Internal.ProtobufList<",
                        (*variables)["boxed_type"], ">")});
      (*variables)["empty_list"] = "emptyProtobufList()";
      (*variables)["make_name_unmodifiable"] =
          absl::StrCat(name, "_.makeImmutable()");
      (*variables)["repeated_get"] = absl::StrCat(name, "_.get");
      (*variables)["repeated_add"] = absl::StrCat(name, "_.add");
      (*variables)["repeated_set"] = absl::StrCat(name, "_.set");
      (*variables)["visit_type"] = "ByteString";
      (*variables)["visit_type_list"] = "visitList";
  }

  if (javaType == JAVATYPE_BYTES) {
    (*variables)["bytes_default"] =
        absl::StrCat(absl::AsciiStrToUpper(name), "_DEFAULT_VALUE");
  }

  if (IsReferenceType(javaType)) {
    // We use `x.getClass()` as a null check because it generates less bytecode
    // than an `if (x == null) { throw ... }` statement.
    (*variables)["null_check"] =
        "  java.lang.Class<?> valueClass = value.getClass();\n";
  } else {
    (*variables)["null_check"] = "";
  }
  // TODO: Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  int fixed_size = FixedSize(GetType(descriptor));
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = absl::StrCat(fixed_size);
  }

  if (HasHasbit(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        absl::StrCat(GenerateSetBit(messageBitIndex), ";");
    (*variables)["clear_has_field_bit_message"] =
        absl::StrCat(GenerateClearBit(messageBitIndex), ";");

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    switch (descriptor->type()) {
      case FieldDescriptor::TYPE_BYTES:
        (*variables)["is_field_present_message"] =
            absl::StrCat("!", name, "_.isEmpty()");
        break;
      case FieldDescriptor::TYPE_FLOAT:
        (*variables)["is_field_present_message"] =
            absl::StrCat("java.lang.Float.floatToRawIntBits(", name, "_) != 0");
        break;
      case FieldDescriptor::TYPE_DOUBLE:
        (*variables)["is_field_present_message"] = absl::StrCat(
            "java.lang.Double.doubleToRawLongBits(", name, "_) != 0");
        break;
      default:
        variables->insert(
            {"is_field_present_message",
             absl::StrCat(name, "_ != ", (*variables)["default"])});
        break;
    }
  }

  // Annotations often use { and } variables to denote ranges.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
}